

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O2

int close_filters(archive_read *a)

{
  archive_read_filter *paVar1;
  int iVar2;
  int iVar3;
  archive_read_filter *paVar4;
  
  iVar3 = 0;
  paVar4 = a->filter;
  while (paVar4 != (archive_read_filter *)0x0) {
    paVar1 = paVar4->upstream;
    if ((paVar4->closed == '\0') && (paVar4->close != (_func_int_archive_read_filter_ptr *)0x0)) {
      iVar2 = (*paVar4->close)(paVar4);
      paVar4->closed = '\x01';
      if (iVar2 < iVar3) {
        iVar3 = iVar2;
      }
    }
    free(paVar4->buffer);
    paVar4->buffer = (char *)0x0;
    paVar4 = paVar1;
  }
  return iVar3;
}

Assistant:

static int
close_filters(struct archive_read *a)
{
	struct archive_read_filter *f = a->filter;
	int r = ARCHIVE_OK;
	/* Close each filter in the pipeline. */
	while (f != NULL) {
		struct archive_read_filter *t = f->upstream;
		if (!f->closed && f->close != NULL) {
			int r1 = (f->close)(f);
			f->closed = 1;
			if (r1 < r)
				r = r1;
		}
		free(f->buffer);
		f->buffer = NULL;
		f = t;
	}
	return r;
}